

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O0

int funchook_destroy(funchook_t *funchook)

{
  uint uVar1;
  funchook_t *in_RDI;
  int rv;
  funchook_t *local_18;
  
  funchook_log(in_RDI,"Enter funchook_destroy(%p)\n",in_RDI);
  local_18 = in_RDI;
  uVar1 = funchook_destroy_internal(in_RDI);
  if (uVar1 == 0) {
    local_18 = (funchook_t *)0x0;
  }
  funchook_log_end(local_18,"Leave funchook_destroy() => %d\n",(ulong)uVar1);
  return uVar1;
}

Assistant:

int funchook_destroy(funchook_t *funchook)
{
    int rv;

    funchook_log(funchook, "Enter funchook_destroy(%p)\n", funchook);
    rv = funchook_destroy_internal(funchook);
    funchook_log_end(rv == 0 ? NULL : funchook, "Leave funchook_destroy() => %d\n", rv);
    return rv;
}